

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O0

void __thiscall
pzgeom::TPZArc3D::X<Fad<double>>
          (TPZArc3D *this,TPZFMatrix<double> *coord,TPZVec<Fad<double>_> *loc,
          TPZVec<Fad<double>_> *result)

{
  Fad<double> *x;
  Fad<double> *this_00;
  Fad<double> *x_00;
  TPZFMatrix<Fad<double>_> *this_01;
  TPZVec<Fad<double>_> *in_RCX;
  TPZVec<Fad<double>_> *in_RDX;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>,_FadCst<double>_>_>
  *in_RDI;
  Fad<double> *e;
  int j_1;
  int i_1;
  int j;
  int i;
  Fad<double> vectRotated;
  Fad<double> centerCoord;
  Fad<double> deflection;
  TPZFNMatrix<4,_Fad<double>_> RotMatrix;
  TPZManVector<Fad<double>,_3> MappedBASE2D;
  Fad<double> *in_stack_fffffffffffffba0;
  FadExpr<FadFuncSin<Fad<double>_>_> *in_stack_fffffffffffffba8;
  TPZManVector<Fad<double>,_3> *in_stack_fffffffffffffbb0;
  Fad<double> *in_stack_fffffffffffffbb8;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffbc0;
  Fad<double> *in_stack_fffffffffffffbd8;
  Fad<double> *this_02;
  Fad<double> *in_stack_fffffffffffffbf8;
  TPZFNMatrix<4,_Fad<double>_> *in_stack_fffffffffffffc00;
  int local_3cc;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  int iVar1;
  int64_t in_stack_fffffffffffffc48;
  TPZManVector<Fad<double>,_3> *in_stack_fffffffffffffc50;
  int local_37c;
  int local_36c;
  Fad<double> local_c0;
  TPZVec<Fad<double>_> local_a0 [4];
  TPZVec<Fad<double>_> *local_20;
  TPZVec<Fad<double>_> *local_18;
  
  this_02 = &local_c0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffffbb0,(double *)in_stack_fffffffffffffba8);
  TPZManVector<Fad<double>,_3>::TPZManVector
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
             (Fad<double> *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
  Fad<double>::~Fad(in_stack_fffffffffffffba0);
  TPZFNMatrix<4,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffffc00,(int64_t)in_stack_fffffffffffffbf8,(int64_t)this_02);
  e = (Fad<double> *)(in_RDI[0x18].fadexpr_.right_.defaultVal * (double)in_RDI[0x19].fadexpr_.left_)
  ;
  TPZVec<Fad<double>_>::operator[](local_18,0);
  operator+<Fad<double>,_double,_nullptr>(in_stack_fffffffffffffbf8,(double)this_02);
  operator*<double,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_nullptr>
            ((double)in_RDI,(FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_> *)e);
  operator/<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>
              *)in_stack_fffffffffffffbf8,(double)this_02);
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<Fad<double>,FadCst<double>>>>>,FadCst<double>>>
            (this_02,in_RDI);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>,_FadCst<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffffba0);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>::
  ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>
            *)in_stack_fffffffffffffba0);
  FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffffba0);
  cos<double>(in_stack_fffffffffffffbd8);
  x = TPZFMatrix<Fad<double>_>::operator()
                (in_stack_fffffffffffffbc0,(int64_t)in_stack_fffffffffffffbb8,
                 (int64_t)in_stack_fffffffffffffbb0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffffbc0,
             (FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_fffffffffffffbb8);
  FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_fffffffffffffba0);
  sin<double>(x);
  this_00 = TPZFMatrix<Fad<double>_>::operator()
                      (in_stack_fffffffffffffbc0,(int64_t)in_stack_fffffffffffffbb8,
                       (int64_t)in_stack_fffffffffffffbb0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffffbc0,
             (FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_fffffffffffffbb8);
  FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_fffffffffffffba0);
  sin<double>(x);
  ::operator-(in_stack_fffffffffffffba8);
  x_00 = TPZFMatrix<Fad<double>_>::operator()
                   (in_stack_fffffffffffffbc0,(int64_t)in_stack_fffffffffffffbb8,
                    (int64_t)in_stack_fffffffffffffbb0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffffbc0,
             (FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)in_stack_fffffffffffffbb8
            );
  FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_>::~FadExpr
            ((FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)0x17fa388);
  FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_fffffffffffffba0);
  cos<double>(x);
  this_01 = (TPZFMatrix<Fad<double>_> *)
            TPZFMatrix<Fad<double>_>::operator()
                      (in_stack_fffffffffffffbc0,(int64_t)in_stack_fffffffffffffbb8,
                       (int64_t)in_stack_fffffffffffffbb0);
  Fad<double>::operator=
            ((Fad<double> *)this_01,(FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_fffffffffffffbb8)
  ;
  FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_fffffffffffffba0);
  Fad<double>::Fad((Fad<double> *)in_stack_fffffffffffffbb0);
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffffbb0,(double *)in_stack_fffffffffffffba8);
  for (local_36c = 0; local_36c < 2; local_36c = local_36c + 1) {
    Fad<double>::operator=<double,_nullptr>
              ((Fad<double> *)in_stack_fffffffffffffbb0,(double *)in_stack_fffffffffffffba8);
    for (local_37c = 0; local_37c < 2; local_37c = local_37c + 1) {
      in_stack_fffffffffffffbb8 =
           TPZFMatrix<Fad<double>_>::operator()
                     (this_01,(int64_t)in_stack_fffffffffffffbb8,(int64_t)in_stack_fffffffffffffbb0)
      ;
      in_stack_fffffffffffffbb0 =
           (TPZManVector<Fad<double>,_3> *)
           TPZVec<double>::operator[]
                     ((TPZVec<double> *)&in_RDI[0x16].fadexpr_.right_,(long)local_37c);
      operator*<Fad<double>,_double,_nullptr>(in_stack_fffffffffffffbf8,(double)this_02);
      Fad<double>::operator+=(this_00,(FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)x_00);
      FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffffba0);
    }
    Fad<double>::operator=<double,_nullptr>
              ((Fad<double> *)in_stack_fffffffffffffbb0,(double *)in_stack_fffffffffffffba8);
    operator+<Fad<double>,_Fad<double>,_nullptr>(x,this_00);
    TPZVec<Fad<double>_>::operator[](local_a0,(long)local_36c);
    Fad<double>::operator=
              ((Fad<double> *)this_01,
               (FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffbb8);
    FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffba0);
  }
  TPZVec<Fad<double>_>::operator[](local_a0,2);
  Fad<double>::operator=<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffffbb0,(double *)in_stack_fffffffffffffba8);
  for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
    Fad<double>::operator=<double,_nullptr>
              ((Fad<double> *)in_stack_fffffffffffffbb0,(double *)in_stack_fffffffffffffba8);
    for (local_3cc = 0; local_3cc < 3; local_3cc = local_3cc + 1) {
      in_stack_fffffffffffffba8 =
           (FadExpr<FadFuncSin<Fad<double>_>_> *)
           TPZFMatrix<double>::GetVal
                     ((TPZFMatrix<double> *)&in_RDI[10].fadexpr_.right_.defaultVal,(long)iVar1,
                      (long)local_3cc);
      TPZVec<Fad<double>_>::operator[](local_a0,(long)local_3cc);
      operator*<double,_Fad<double>,_nullptr>((double)in_RDI,e);
      Fad<double>::operator+=(this_00,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)x_00);
      FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffba0);
    }
    in_stack_fffffffffffffba0 =
         (Fad<double> *)
         TPZFMatrix<double>::operator()
                   ((TPZFMatrix<double> *)this_01,(int64_t)in_stack_fffffffffffffbb8,
                    (int64_t)in_stack_fffffffffffffbb0);
    operator+<Fad<double>,_double,_nullptr>(in_stack_fffffffffffffbf8,(double)this_02);
    TPZVec<Fad<double>_>::operator[](local_20,(long)iVar1);
    Fad<double>::operator=
              ((Fad<double> *)this_01,
               (FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffffbb8);
    FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffffba0);
  }
  Fad<double>::~Fad(in_stack_fffffffffffffba0);
  Fad<double>::~Fad(in_stack_fffffffffffffba0);
  Fad<double>::~Fad(in_stack_fffffffffffffba0);
  TPZFNMatrix<4,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<4,_Fad<double>_> *)0x17fa9e4);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_fffffffffffffbb0);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &coord,TPZVec<T> &loc,TPZVec<T> &result) const
        {
            /** Computing initialVector = (iniR2 - CenterR2) */
            TPZManVector<T,3> MappedBASE2D(3,0.);
            
            TPZFNMatrix<4,T> RotMatrix(2,2);
            T deflection = fAngle * fRadius * (loc[0] + 1.) / (2.*fRadius);
            RotMatrix(0,0) =  cos(deflection); RotMatrix(0,1) = sin(deflection);
            RotMatrix(1,0) = -sin(deflection); RotMatrix(1,1) = cos(deflection);
            
            /** MappedPoint_R2 = centerCoord + vectorRotated , where Vx = RotationMatrix . Va */
            T centerCoord, vectRotated = 0.;
            for(int i = 0; i < 2; i++)
            {
                vectRotated = 0.;
                for(int j = 0; j < 2; j++) vectRotated += RotMatrix(i,j)*finitialVector[j];
                centerCoord = (1-i)*fXcenter + i*fYcenter;
                MappedBASE2D[i] = centerCoord + vectRotated;
            }
            
            /** Changing Basis of Obtained MappedPoint from R2 to R3 */
            MappedBASE2D[2] = 0.;
            for(int i = 0; i < 3; i++)
            {
                vectRotated = 0.;
                for(int j = 0; j < 3; j++)
                {
                    vectRotated += fIBaseCn.GetVal(i,j)*MappedBASE2D[j];
                }
                result[i] = vectRotated + coord(i,2);
            }

        }